

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

void __thiscall
CLogOpExp::CLogOpExp
          (CLogOpExp *this,IExpression *leftOperand,IExpression *rightOperand,
          TLogicalOperation operation)

{
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_58;
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_50 [3];
  PositionInfo local_34;
  TLogicalOperation local_24;
  IExpression *pIStack_20;
  TLogicalOperation operation_local;
  IExpression *rightOperand_local;
  IExpression *leftOperand_local;
  CLogOpExp *this_local;
  
  local_24 = operation;
  pIStack_20 = rightOperand;
  rightOperand_local = leftOperand;
  leftOperand_local = &this->super_IExpression;
  IExpression::IExpression((IExpression *)this);
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00236ec0;
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->leftOperand);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->rightOperand);
  local_34 = PositionInfo::operator+
                       (&(rightOperand_local->super_PositionedNode).position,
                        &(pIStack_20->super_PositionedNode).position);
  (this->super_IExpression).super_PositionedNode.position = local_34;
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)local_50,rightOperand_local
            );
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->leftOperand,local_50);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(local_50);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&local_58,pIStack_20);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->rightOperand,&local_58);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(&local_58);
  this->operation = local_24;
  return;
}

Assistant:

CLogOpExp::CLogOpExp(
        IExpression *leftOperand,
        IExpression *rightOperand,
        enums::TLogicalOperation operation
) {
    this->position = leftOperand->position + rightOperand->position;
    this->leftOperand = std::unique_ptr<IExpression>( leftOperand );
    this->rightOperand = std::unique_ptr<IExpression>( rightOperand );
    this->operation = operation;
}